

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,char *filename)

{
  int *piVar1;
  int iVar2;
  REF_INT RVar3;
  REF_MPI ref_mpi;
  REF_NODE pRVar4;
  REF_GEOM ref_geom;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  REF_SIZE RVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  REF_STATUS RVar13;
  size_t sVar14;
  REF_GEOM pRVar15;
  void *pvVar16;
  FILE *pFVar17;
  REF_GEOM pRVar18;
  size_t sVar19;
  uint *puVar20;
  uint uVar21;
  undefined8 uVar22;
  REF_GLOB value;
  REF_INT RVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  REF_LONG ref_private_status_reis_ai;
  char *pcVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  int length;
  char nul;
  char ref_point_desc [1];
  REF_LONG ntri;
  char mesh_units [12];
  char mesh_name [16];
  char coordinate_system [7];
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_LONG ntet;
  REF_GLOB *l2c;
  REF_LONG nedg;
  REF_GLOB nnode;
  char file_description [7];
  char *patch_type;
  int refined;
  int precision;
  int n_meshes;
  int revision_number;
  int magic_number;
  char mesh_generator [7];
  char magic_string [7];
  char *patch_label;
  char contact_info [12];
  char element_scheme [8];
  double model_scale;
  char mesh_type [8];
  int dimension;
  REF_BOOL in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  FILE *local_1b8;
  uint local_1ac;
  uint local_19c;
  REF_GEOM local_198;
  ulong local_190;
  REF_NODE local_188;
  char local_179;
  REF_MPI local_178;
  uint local_170 [3];
  undefined4 local_164;
  ulong local_158;
  char acStack_150 [8];
  undefined4 local_148;
  undefined3 uStack_144;
  void *local_140;
  int local_134;
  void *local_130;
  uint local_124;
  uint local_120 [2];
  REF_GLOB *local_118;
  undefined6 uStack_110;
  undefined2 uStack_10a;
  undefined6 uStack_108;
  uint local_100 [2];
  REF_DBL *local_f8 [6];
  undefined4 local_c8;
  undefined3 uStack_c4;
  void *local_c0;
  void *local_b8;
  ulong local_b0;
  ulong local_a8;
  char *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined3 uStack_7c;
  undefined4 local_78;
  undefined3 uStack_74;
  void *local_70;
  char *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  
  sVar14 = strlen(filename);
  if (sVar14 < 5) {
LAB_00178015:
    if ((10 < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 10),".lb8.ugrid"), iVar10 == 0)) {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,0,0);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".lb8.ugrid failed";
      uVar22 = 0xb7a;
      goto LAB_00178972;
    }
    if ((9 < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 9),".b8.ugrid"), iVar10 == 0)) {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,1,0);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".b8.ugrid failed";
      uVar22 = 0xb80;
      goto LAB_00178972;
    }
    if ((0xb < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 0xb),".lb8l.ugrid"), iVar10 == 0)) {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,0,1);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".lb8l.ugrid failed";
      uVar22 = 0xb86;
      goto LAB_00178972;
    }
    if ((10 < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 10),".b8l.ugrid"), iVar10 == 0)) {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,1,1);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".b8l.ugrid failed";
      uVar22 = 0xb8c;
      goto LAB_00178972;
    }
    if ((0xc < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 0xc),".lb8.ugrid64"), iVar10 == 0))
    {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,0,1);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".lb8.ugrid64 failed";
      uVar22 = 0xb92;
      goto LAB_00178972;
    }
    if ((0xb < sVar14) && (iVar10 = strcmp(filename + (sVar14 - 0xb),".b8.ugrid64"), iVar10 == 0)) {
      local_1ac = ref_gather_bin_ugrid(ref_grid,filename,1,1);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = ".b8.ugrid64 failed";
      uVar22 = 0xb98;
      goto LAB_00178972;
    }
    if ((sVar14 < 7) || (iVar10 = strcmp(filename + (sVar14 - 6),".meshb"), iVar10 != 0)) {
      printf("%s: %d: %s %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xba0,"output file name extension unknown",filename);
      return 1;
    }
    pRVar4 = ref_grid->node;
    ref_geom = ref_grid->geom;
    uVar11 = ref_node_synchronize_globals(pRVar4);
    if (uVar11 == 0) {
      local_100[0] = (ref_grid->twod == 0) + 2;
      local_164 = 2;
      iVar10 = ref_grid->meshb_version;
      if ((ref_grid->meshb_version < 2) && (iVar10 = local_164, 10000000 < pRVar4->old_n_global)) {
        iVar10 = (200000000 < pRVar4->old_n_global) + 3;
      }
      local_164 = iVar10;
      bVar32 = 3 < local_164;
      bVar9 = 2 < local_164;
      local_198 = (REF_GEOM)0x0;
      local_188 = pRVar4;
      if (ref_grid->mpi->id == 0) {
        local_178 = (REF_MPI)CONCAT44(local_178._4_4_,local_164);
        pFVar17 = fopen(filename,"w");
        if (pFVar17 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x8de,"ref_gather_meshb","unable to open file");
          local_1ac = 2;
        }
        else {
          local_190 = CONCAT71(local_190._1_7_,bVar32);
          local_60 = CONCAT44(local_60._4_4_,1);
          sVar14 = fwrite(&local_60,4,1,pFVar17);
          if (sVar14 == 1) {
            sVar14 = fwrite(&local_164,4,1,pFVar17);
            if (sVar14 == 1) {
              lVar27 = ftell(pFVar17);
              local_170[0] = 3;
              sVar14 = fwrite(local_170,4,1,pFVar17);
              if (sVar14 == 1) {
                local_198 = (REF_GEOM)((ulong)((uint)bVar9 * 4 + 8) + lVar27 + 4);
                local_1ac = ref_export_meshb_next_position
                                      ((FILE *)pFVar17,local_164,(REF_FILEPOS)local_198);
                if (local_1ac == 0) {
                  sVar14 = fwrite(local_100,4,1,pFVar17);
                  if (sVar14 == 1) {
                    pRVar18 = (REF_GEOM)ftell(pFVar17);
                    pRVar15 = local_198;
                    local_1ac = uVar11;
                    if (local_198 != pRVar18) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x8e9,"ref_gather_meshb","dim inconsistent",local_198,pRVar18);
                      local_1ac = 1;
                    }
                    uVar11 = local_1ac;
                    iVar10 = (REF_INT)local_178;
                    if (pRVar15 == pRVar18) goto LAB_00178b80;
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x8e8,"ref_gather_meshb","dim",1,sVar14);
                    local_1ac = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x8e7,"ref_gather_meshb",(ulong)local_1ac,"next p");
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x8e6,"ref_gather_meshb","dim code",1,sVar14);
                local_1ac = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x8e2,"ref_gather_meshb","version",1,sVar14);
              local_1ac = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x8e1,"ref_gather_meshb","code",1,sVar14);
            local_1ac = 1;
          }
        }
      }
      else {
        pFVar17 = (FILE *)0x0;
        iVar10 = local_164;
        local_190._0_1_ = bVar32;
LAB_00178b80:
        pRVar4 = local_188;
        uVar26 = (ulong)(byte)local_190;
        uVar21 = (uint)(byte)local_190 * 4 + 4;
        local_a8 = (ulong)uVar21;
        uVar12 = (uint)(byte)local_190 * 4 + (uint)bVar9 * 4 + 0xc;
        local_190 = uVar26;
        if (ref_grid->mpi->id == 0) {
          local_178 = (REF_MPI)CONCAT44(local_178._4_4_,iVar10);
          lVar30 = (long)(int)local_100[0];
          lVar27 = local_188->old_n_global;
          lVar24 = ftell(pFVar17);
          local_170[0] = 4;
          sVar14 = fwrite(local_170,4,1,pFVar17);
          RVar23 = local_164;
          if (sVar14 == 1) {
            local_198 = (REF_GEOM)(lVar24 + (ulong)uVar12 + ((ulong)uVar21 + lVar30 * 8) * lVar27);
            local_1ac = ref_export_meshb_next_position
                                  ((FILE *)pFVar17,local_164,(REF_FILEPOS)local_198);
            if (local_1ac == 0) {
              uVar21 = ref_gather_meshb_glob((FILE *)pFVar17,RVar23,pRVar4->old_n_global);
              local_1ac = uVar11;
              if (uVar21 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x8f5,"ref_gather_meshb",(ulong)uVar21,"nnode");
                local_1ac = uVar21;
              }
              uVar11 = local_1ac;
              iVar10 = (REF_INT)local_178;
              if (uVar21 == 0) goto LAB_00178bbd;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x8f3,"ref_gather_meshb",(ulong)local_1ac,"next p");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x8f2,"ref_gather_meshb","vertex version code",1,sVar14);
            local_1ac = 1;
          }
        }
        else {
LAB_00178bbd:
          RVar23 = local_164;
          local_1ac = ref_gather_node(local_188,0,local_164,ref_grid->twod,(FILE *)pFVar17);
          if (local_1ac == 0) {
            if (ref_grid->mpi->id == 0) {
              pRVar15 = (REF_GEOM)ftell(pFVar17);
              local_1ac = uVar11;
              if (local_198 != pRVar15) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x8fb,"ref_gather_meshb","vertex inconsistent",local_198,pRVar15);
                local_1ac = 1;
              }
              uVar11 = local_1ac;
              if (local_198 != pRVar15) goto LAB_001788a3;
            }
            local_b0 = (ulong)uVar12;
            lVar27 = 2;
            local_178 = (REF_MPI)CONCAT44(local_178._4_4_,RVar23);
            do {
              pRVar5 = ref_grid->cell[lVar27 + -2];
              local_1ac = ref_cell_ncell(pRVar5,local_188,(REF_LONG *)&local_118);
              if (local_1ac != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x8fe,"ref_gather_meshb",(ulong)local_1ac,"ncell");
                goto LAB_001788a3;
              }
              if (0 < (long)local_118) {
                if (ref_grid->mpi->id == 0) {
                  local_1ac = ref_cell_meshb_keyword(pRVar5,(REF_INT *)local_170);
                  if (local_1ac != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x901,"ref_gather_meshb",(ulong)local_1ac,"kw");
                    goto LAB_001788a3;
                  }
                  iVar28 = pRVar5->node_per;
                  local_198 = (REF_GEOM)ftell(pFVar17);
                  lVar30 = (long)(iVar28 + 1 << (3 < iVar10 | 2U)) * (long)local_118;
                  sVar14 = fwrite(local_170,4,1,pFVar17);
                  if (sVar14 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x906,"ref_gather_meshb","keyword code",1,sVar14);
                    local_1ac = 1;
                    goto LAB_001788a3;
                  }
                  local_198 = (REF_GEOM)((long)&local_198->n + lVar30 + local_b0);
                  RVar23 = (REF_INT)local_178;
                  local_1ac = ref_export_meshb_next_position
                                        ((FILE *)pFVar17,(REF_INT)local_178,(REF_FILEPOS)local_198);
                  if (local_1ac != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x908,"ref_gather_meshb",(ulong)local_1ac,"next");
                    goto LAB_001788a3;
                  }
                  RVar13 = ref_gather_meshb_glob((FILE *)pFVar17,RVar23,(REF_GLOB)local_118);
                  if (RVar13 != 0) {
                    local_1ac = 1;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x909,"ref_gather_meshb",1,"ncell");
                    goto LAB_001788a3;
                  }
                }
                local_1ac = ref_gather_cell(local_188,pRVar5,0,1,0,(REF_BOOL)local_190,0,
                                            (REF_INT)pFVar17,in_stack_fffffffffffffe38,
                                            (FILE *)CONCAT44(in_stack_fffffffffffffe44,
                                                             in_stack_fffffffffffffe40));
                if (local_1ac != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x90e,"ref_gather_meshb",(ulong)local_1ac,"nodes");
                  goto LAB_001788a3;
                }
                if (ref_grid->mpi->id == 0) {
                  pRVar15 = (REF_GEOM)ftell(pFVar17);
                  local_1ac = uVar11;
                  if (local_198 != pRVar15) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x910,"ref_gather_meshb","cell inconsistent",local_198,pRVar15);
                    local_1ac = 1;
                  }
                  uVar11 = local_1ac;
                  if (local_198 != pRVar15) goto LAB_001788a3;
                }
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x12);
            local_a8 = (ulong)(uint)((int)local_a8 * 2);
            uVar26 = 0;
            do {
              local_170[0] = (uint)uVar26 | 0x28;
              local_1ac = ref_gather_ngeom(local_188,ref_geom,(uint)uVar26,(REF_INT *)local_120);
              if (local_1ac != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x916,"ref_gather_meshb",(ulong)local_1ac,"ngeom");
                goto LAB_001788a3;
              }
              lVar27 = (long)(int)local_120[0];
              local_1ac = uVar11;
              if (0 < lVar27) {
                local_190 = uVar26;
                if (ref_grid->mpi->id == 0) {
                  uVar31 = (ulong)(local_120[0] * 8);
                  if (uVar26 == 0) {
                    uVar31 = 0;
                  }
                  lVar30 = ftell(pFVar17);
                  sVar14 = fwrite(local_170,4,1,pFVar17);
                  RVar23 = local_164;
                  if (sVar14 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x91e,"ref_gather_meshb","vertex version code",1,sVar14);
                    local_1ac = 1;
                    goto LAB_001788a3;
                  }
                  local_198 = (REF_GEOM)
                              (uVar31 + lVar30 + (local_a8 + local_190 * 8) * lVar27 + local_b0);
                  local_1ac = ref_export_meshb_next_position
                                        ((FILE *)pFVar17,local_164,(REF_FILEPOS)local_198);
                  if (local_1ac != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x91f,"ref_gather_meshb",(ulong)local_1ac,"np");
                    goto LAB_001788a3;
                  }
                  RVar13 = ref_gather_meshb_int((FILE *)pFVar17,RVar23,local_120[0]);
                  if (RVar13 != 0) {
                    local_1ac = 1;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x920,"ref_gather_meshb",1,"ngeom");
                    goto LAB_001788a3;
                  }
                }
                local_130 = (void *)CONCAT44(local_130._4_4_,local_164);
                local_178 = local_188->ref_mpi;
                if ((local_178->id == 0) && (0 < ref_geom->max)) {
                  lVar27 = 0;
                  lVar30 = 0;
                  do {
                    pRVar6 = ref_geom->descr;
                    if (local_190 == (uint)pRVar6[lVar30 * 6]) {
                      iVar10 = pRVar6[lVar30 * 6 + 5];
                      if (local_178->id == local_188->part[iVar10]) {
                        if ((iVar10 < 0) || (local_188->max <= iVar10)) {
                          value = 0;
                        }
                        else {
                          value = 0;
                          if (-1 < local_188->global[iVar10]) {
                            value = local_188->global[iVar10] + 1;
                          }
                        }
                        RVar23 = pRVar6[lVar30 * 6 + 1];
                        local_f8[0] = (REF_DBL *)(double)pRVar6[lVar30 * 6 + 2];
                        RVar3 = (REF_INT)local_130;
                        RVar13 = ref_gather_meshb_glob((FILE *)pFVar17,(REF_INT)local_130,value);
                        if (RVar13 != 0) {
                          local_1ac = 1;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x864,"ref_gather_geom",1,"node");
                          uVar26 = local_190;
                          goto LAB_0017986c;
                        }
                        RVar13 = ref_gather_meshb_int((FILE *)pFVar17,RVar3,RVar23);
                        if (RVar13 != 0) {
                          local_1ac = 1;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x865,"ref_gather_geom",1,"id");
                          uVar26 = local_190;
                          goto LAB_0017986c;
                        }
                        lVar24 = lVar27;
                        uVar26 = local_190;
                        if (local_190 != 0) {
                          do {
                            sVar14 = fwrite((void *)((long)ref_geom->param + lVar24),8,1,pFVar17);
                            if (sVar14 != 1) {
                              uVar22 = 0x86a;
                              goto LAB_00179845;
                            }
                            lVar24 = lVar24 + 8;
                            uVar26 = uVar26 - 1;
                          } while (uVar26 != 0);
                          sVar14 = fwrite(local_f8,8,1,pFVar17);
                          if (sVar14 != 1) {
                            uVar22 = 0x86c;
LAB_00179845:
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,uVar22,"ref_gather_geom","id",1,sVar14);
                            local_1ac = 1;
                            uVar26 = local_190;
                            goto LAB_0017986c;
                          }
                        }
                      }
                    }
                    lVar30 = lVar30 + 1;
                    lVar27 = lVar27 + 0x10;
                  } while (lVar30 < ref_geom->max);
                }
                pRVar4 = local_188;
                uVar26 = local_190;
                if (local_178->id == 0) {
                  if (local_178->n < 2) {
                    local_1ac = 0;
                  }
                  else {
                    RVar23 = 1;
                    do {
                      local_140 = (void *)CONCAT44(local_140._4_4_,RVar23);
                      local_1ac = ref_mpi_gather_recv(local_178,&local_158,1,1,RVar23);
                      if (local_1ac != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x873,"ref_gather_geom",(ulong)local_1ac,"recv ngeom");
                        goto LAB_0017986c;
                      }
                      iVar10 = (int)local_158;
                      if (0 < (int)local_158) {
                        iVar28 = (int)local_158 * 3;
                        local_b8 = malloc((local_158 & 0xffffffff) * 0x18);
                        if (local_b8 == (void *)0x0) {
                          uVar22 = 0x875;
                          pcVar29 = "malloc node_id of REF_GLOB NULL";
                        }
                        else {
                          local_c0 = malloc((ulong)(uint)(iVar10 * 2) << 3);
                          if (local_c0 != (void *)0x0) {
                            local_1ac = ref_mpi_gather_recv(local_178,local_b8,iVar28,2,
                                                            (REF_INT)local_140);
                            if (local_1ac == 0) {
                              local_1ac = ref_mpi_gather_recv(local_178,local_c0,(int)local_158 * 2,
                                                              3,(REF_INT)local_140);
                              if (local_1ac == 0) {
                                if (0 < (int)local_158) {
                                  local_70 = local_c0;
                                  lVar27 = 0;
                                  do {
                                    RVar23 = *(REF_INT *)((long)local_b8 + lVar27 * 0x18 + 8);
                                    local_f8[0] = (REF_DBL *)
                                                  (double)*(long *)((long)local_b8 +
                                                                   lVar27 * 0x18 + 0x10);
                                    RVar13 = ref_gather_meshb_glob
                                                       ((FILE *)pFVar17,(REF_INT)local_130,
                                                        *(long *)((long)local_b8 + lVar27 * 0x18) +
                                                        1);
                                    if (RVar13 != 0) {
                                      local_1ac = 1;
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,0x880,"ref_gather_geom",1,"node");
                                      goto LAB_0017986c;
                                    }
                                    local_1ac = ref_gather_meshb_int
                                                          ((FILE *)pFVar17,(REF_INT)local_130,RVar23
                                                          );
                                    uVar31 = uVar26;
                                    pvVar16 = local_70;
                                    if (local_1ac != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,0x881,"ref_gather_geom",(ulong)local_1ac,"id");
                                      goto LAB_0017986c;
                                    }
                                    for (; uVar26 = local_190, local_190 = uVar26, uVar31 != 0;
                                        uVar31 = uVar31 - 1) {
                                      sVar14 = fwrite(pvVar16,8,1,pFVar17);
                                      if (sVar14 != 1) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                               ,0x884,"ref_gather_geom","id",1,sVar14);
                                        local_1ac = 1;
                                        uVar26 = local_190;
                                        goto LAB_0017986c;
                                      }
                                      pvVar16 = (void *)((long)pvVar16 + 8);
                                    }
                                    if ((uVar26 != 0) &&
                                       (sVar14 = fwrite(local_f8,8,1,pFVar17), sVar14 != 1)) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,0x886,"ref_gather_geom","id",1,sVar14);
                                      local_1ac = 1;
                                      goto LAB_0017986c;
                                    }
                                    lVar27 = lVar27 + 1;
                                    local_70 = (void *)((long)local_70 + 0x10);
                                  } while (lVar27 < (int)local_158);
                                }
                                free(local_c0);
                                free(local_b8);
                                goto LAB_001797f6;
                              }
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x87b,"ref_gather_geom",(ulong)local_1ac,"recv param");
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x879,"ref_gather_geom",(ulong)local_1ac,"recv node_id");
                            }
                            goto LAB_0017986c;
                          }
                          uVar22 = 0x876;
                          pcVar29 = "malloc param of REF_DBL NULL";
                        }
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,uVar22,"ref_gather_geom",pcVar29);
                        local_1ac = 2;
                        goto LAB_0017986c;
                      }
LAB_001797f6:
                      RVar23 = (REF_INT)local_140 + 1;
                    } while (RVar23 < local_178->n);
                    local_1ac = 0;
                  }
                }
                else {
                  local_158 = local_158 & 0xffffffff00000000;
                  if (0 < (long)ref_geom->max) {
                    lVar27 = 0;
                    iVar10 = 0;
                    do {
                      if ((local_190 == *(uint *)((long)ref_geom->descr + lVar27)) &&
                         (local_178->id ==
                          local_188->part[*(int *)((long)ref_geom->descr + lVar27 + 0x14)])) {
                        iVar10 = iVar10 + 1;
                        local_158 = CONCAT44(local_158._4_4_,iVar10);
                      }
                      lVar27 = lVar27 + 0x18;
                    } while ((long)ref_geom->max * 0x18 != lVar27);
                  }
                  local_1ac = ref_mpi_gather_send(local_178,&local_158,1,1);
                  if (local_1ac == 0) {
                    iVar10 = (int)local_158;
                    if ((int)local_158 < 1) {
                      local_1ac = 0;
                      uVar26 = local_190;
                    }
                    else {
                      local_130 = malloc((local_158 & 0xffffffff) * 0x18);
                      if (local_130 == (void *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x896,"ref_gather_geom","malloc node_id of REF_GLOB NULL");
                        local_1ac = 2;
                        uVar26 = local_190;
                      }
                      else {
                        pvVar16 = malloc((ulong)(uint)(iVar10 * 2) * 8);
                        if (pvVar16 == (void *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x897,"ref_gather_geom","malloc param of REF_DBL NULL");
                          local_1ac = 2;
                          local_140 = (void *)0x0;
                          uVar26 = local_190;
                        }
                        else {
                          memset(pvVar16,0,(ulong)(iVar10 * 2 - 2) * 8 + 0x10);
                          local_158 = local_158 & 0xffffffff00000000;
                          iVar10 = ref_geom->max;
                          if (0 < (long)iVar10) {
                            pRVar6 = ref_geom->descr;
                            lVar27 = 0;
                            lVar30 = 0;
                            iVar28 = 0;
                            do {
                              if (local_190 == (uint)pRVar6[lVar30 * 6]) {
                                iVar2 = pRVar6[lVar30 * 6 + 5];
                                if (local_178->id == pRVar4->part[iVar2]) {
                                  lVar24 = -1;
                                  if (((-1 < iVar2) && (iVar2 < pRVar4->max)) &&
                                     (lVar24 = pRVar4->global[iVar2], lVar24 < 0)) {
                                    lVar24 = -1;
                                  }
                                  lVar25 = (long)(iVar28 * 3);
                                  *(long *)((long)local_130 + lVar25 * 8) = lVar24;
                                  *(long *)((long)local_130 + lVar25 * 8 + 8) =
                                       (long)pRVar6[lVar30 * 6 + 1];
                                  *(long *)((long)local_130 + lVar25 * 8 + 0x10) =
                                       (long)pRVar6[lVar30 * 6 + 2];
                                  if (local_190 != 0) {
                                    pRVar7 = ref_geom->param;
                                    uVar26 = 0;
                                    do {
                                      *(undefined8 *)
                                       ((long)pvVar16 + uVar26 * 8 + (long)(iVar28 * 2) * 8) =
                                           *(undefined8 *)((long)pRVar7 + uVar26 * 8 + lVar27);
                                      uVar26 = uVar26 + 1;
                                    } while (local_190 != uVar26);
                                  }
                                  iVar28 = iVar28 + 1;
                                  local_158 = CONCAT44(local_158._4_4_,iVar28);
                                }
                              }
                              lVar30 = lVar30 + 1;
                              lVar27 = lVar27 + 0x10;
                            } while (lVar30 != iVar10);
                          }
                          local_140 = pvVar16;
                          local_1ac = ref_mpi_gather_send(local_178,local_130,(int)local_158 * 3,2);
                          if (local_1ac == 0) {
                            local_1ac = ref_mpi_gather_send(local_178,local_140,(int)local_158 * 2,3
                                                           );
                            if (local_1ac == 0) {
                              if (local_140 != (void *)0x0) {
                                free(local_140);
                              }
                              free(local_130);
                              local_1ac = 0;
                              uVar26 = local_190;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x8a8,"ref_gather_geom",(ulong)local_1ac,"send param");
                              uVar26 = local_190;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x8a6,"ref_gather_geom",(ulong)local_1ac,"send node_id");
                            uVar26 = local_190;
                          }
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x894,"ref_gather_geom",(ulong)local_1ac,"send ngeom");
                  }
                }
LAB_0017986c:
                if (local_1ac != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x922,"ref_gather_meshb",(ulong)local_1ac,"nodes");
                  goto LAB_001788a3;
                }
                local_1ac = uVar11;
                if (ref_grid->mpi->id == 0) {
                  pRVar15 = (REF_GEOM)ftell(pFVar17);
                  if (local_198 != pRVar15) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x924,"ref_gather_meshb","geom inconsistent",local_198,pRVar15);
                    local_1ac = 1;
                  }
                  if (local_198 != pRVar15) goto LAB_001788a3;
                }
              }
              uVar26 = uVar26 + 1;
              uVar11 = local_1ac;
            } while (uVar26 != 3);
            if ((ref_grid->mpi->id == 0) && (RVar8 = ref_geom->cad_data_size, RVar8 != 0)) {
              local_170[0] = 0x7e;
              lVar27 = ftell(pFVar17);
              sVar14 = fwrite(local_170,4,1,pFVar17);
              RVar23 = local_164;
              if (sVar14 == 1) {
                lVar27 = RVar8 + local_b0 + lVar27;
                local_1ac = ref_export_meshb_next_position((FILE *)pFVar17,local_164,lVar27);
                if (local_1ac == 0) {
                  local_1ac = ref_gather_meshb_size((FILE *)pFVar17,RVar23,ref_geom->cad_data_size);
                  if (local_1ac == 0) {
                    sVar14 = ref_geom->cad_data_size;
                    sVar19 = fwrite(ref_geom->cad_data,1,sVar14,pFVar17);
                    if (sVar14 == sVar19) {
                      lVar30 = ftell(pFVar17);
                      if (lVar27 == lVar30) goto LAB_0017abfe;
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x934,"ref_gather_meshb","cad_model inconsistent",lVar27,lVar30);
                      local_1ac = 1;
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x933,"ref_gather_meshb","node",sVar14,sVar19);
                      local_1ac = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x92f,"ref_gather_meshb",(ulong)local_1ac,"cad size");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x92d,"ref_gather_meshb",(ulong)local_1ac,"next p");
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x92c,"ref_gather_meshb","keyword",1,sVar14);
                local_1ac = 1;
              }
            }
            else {
LAB_0017abfe:
              local_1ac = 0;
              if (ref_grid->mpi->id == 0) {
                local_170[0] = 0x36;
                sVar14 = fwrite(local_170,4,1,pFVar17);
                if (sVar14 == 1) {
                  local_1ac = ref_export_meshb_next_position((FILE *)pFVar17,local_164,0);
                  if (local_1ac == 0) {
                    fclose(pFVar17);
                    local_1ac = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x93b,"ref_gather_meshb",(ulong)local_1ac,"next p");
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x939,"ref_gather_meshb","vertex version code",1,sVar14);
                  local_1ac = 1;
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x8f9,"ref_gather_meshb",(ulong)local_1ac,"nodes");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8c5,"ref_gather_meshb",(ulong)uVar11,"sync");
      local_1ac = uVar11;
    }
LAB_001788a3:
    if (local_1ac == 0) {
      return 0;
    }
    pcVar29 = "meshb failed";
    uVar22 = 0xb9d;
    goto LAB_00178972;
  }
  pcVar29 = filename + (sVar14 - 4);
  iVar10 = strcmp(pcVar29,".tec");
  if (((iVar10 == 0) || (iVar10 = strcmp(pcVar29,".dat"), iVar10 == 0)) ||
     (iVar10 = strcmp(filename + (sVar14 - 2),".t"), iVar10 == 0)) {
    pRVar4 = ref_grid->node;
    local_1ac = ref_node_synchronize_globals(pRVar4);
    if (local_1ac == 0) {
      if (ref_grid->mpi->id == 0) {
        pFVar17 = fopen(filename,"w");
        if (pFVar17 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x443,"ref_gather_tec","unable to open file");
          local_1ac = 2;
          goto LAB_0017894d;
        }
        fwrite("title=\"geometry\"\n",0x11,1,pFVar17);
        fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar17);
      }
      else {
        pFVar17 = (FILE *)0x0;
      }
      pRVar5 = ref_grid->cell[0];
      local_1ac = ref_grid_compact_cell_nodes
                            (ref_grid,pRVar5,(REF_GLOB *)local_f8,(REF_LONG *)&local_158,&local_118)
      ;
      if (local_1ac == 0) {
        if ((long)local_158 < 1 || (long)local_f8[0] < 1) {
LAB_00178451:
          if (local_118 != (REF_GLOB *)0x0) {
            free(local_118);
          }
          pRVar5 = ref_grid->cell[3];
          local_1ac = ref_grid_compact_cell_nodes
                                (ref_grid,pRVar5,(REF_GLOB *)local_f8,(REF_LONG *)&local_158,
                                 &local_118);
          if (local_1ac == 0) {
            if ((long)local_158 < 1 || (long)local_f8[0] < 1) {
LAB_001785d7:
              if (local_118 != (REF_GLOB *)0x0) {
                free(local_118);
              }
              pRVar5 = ref_grid->cell[8];
              local_1ac = ref_grid_compact_cell_nodes
                                    (ref_grid,pRVar5,(REF_GLOB *)local_f8,(REF_LONG *)&local_158,
                                     &local_118);
              if (local_1ac == 0) {
                if ((long)local_158 < 1 || (long)local_f8[0] < 1) {
LAB_0017875d:
                  if (local_118 != (REF_GLOB *)0x0) {
                    free(local_118);
                  }
                  local_1ac = 0;
                  if (ref_grid->mpi->id == 0) {
                    fclose(pFVar17);
                    local_1ac = 0;
                  }
                }
                else {
                  if (ref_grid->mpi->id == 0) {
                    fprintf(pFVar17,
                            "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                           );
                  }
                  local_1ac = ref_gather_node_tec_part
                                        (pRVar4,(REF_GLOB)local_f8[0],local_118,0,(REF_DBL *)0x0,
                                         (FILE *)pFVar17);
                  if (local_1ac == 0) {
                    local_1ac = ref_gather_cell_tec(pRVar4,pRVar5,local_158,local_118,0,
                                                    (FILE *)pFVar17);
                    if (local_1ac == 0) goto LAB_0017875d;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x478,"ref_gather_tec",(ulong)local_1ac,"nodes");
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x476,"ref_gather_tec",(ulong)local_1ac,"nodes");
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x46d,"ref_gather_tec",(ulong)local_1ac,"l2c");
              }
            }
            else {
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar17,
                        "zone t=\"face\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n");
              }
              local_1ac = ref_gather_node_tec_part
                                    (pRVar4,(REF_GLOB)local_f8[0],local_118,0,(REF_DBL *)0x0,
                                     (FILE *)pFVar17);
              if (local_1ac == 0) {
                local_1ac = ref_gather_cell_tec(pRVar4,pRVar5,local_158,local_118,0,(FILE *)pFVar17)
                ;
                if (local_1ac == 0) goto LAB_001785d7;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x467,"ref_gather_tec",(ulong)local_1ac,"nodes");
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x465,"ref_gather_tec",(ulong)local_1ac,"nodes");
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x45c,"ref_gather_tec",(ulong)local_1ac,"l2c");
          }
        }
        else {
          if (ref_grid->mpi->id == 0) {
            fprintf(pFVar17,
                    "zone t=\"edge\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n");
          }
          local_1ac = ref_gather_node_tec_part
                                (pRVar4,(REF_GLOB)local_f8[0],local_118,0,(REF_DBL *)0x0,
                                 (FILE *)pFVar17);
          if (local_1ac == 0) {
            local_1ac = ref_gather_cell_tec(pRVar4,pRVar5,local_158,local_118,0,(FILE *)pFVar17);
            if (local_1ac == 0) goto LAB_00178451;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x456,"ref_gather_tec",(ulong)local_1ac,"nodes");
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x454,"ref_gather_tec",(ulong)local_1ac,"nodes");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               1099,"ref_gather_tec",(ulong)local_1ac,"l2c");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x43d,"ref_gather_tec",(ulong)local_1ac,"sync");
    }
LAB_0017894d:
    if (local_1ac == 0) {
      return 0;
    }
    pcVar29 = "scalar tec";
    uVar22 = 0xb69;
    goto LAB_00178972;
  }
  iVar10 = strcmp(pcVar29,".avm");
  if (iVar10 != 0) {
    iVar10 = strcmp(pcVar29,".plt");
    if (iVar10 == 0) {
      local_1ac = ref_gather_scalar_by_extension(ref_grid,0,(REF_DBL *)0x0,(char **)0x0,filename);
      if (local_1ac == 0) {
        return 0;
      }
      pcVar29 = "scalar plt";
      uVar22 = 0xb74;
      goto LAB_00178972;
    }
    goto LAB_00178015;
  }
  ref_mpi = ref_grid->mpi;
  pRVar4 = ref_grid->node;
  uVar11 = ref_node_synchronize_globals(pRVar4);
  if (uVar11 == 0) {
    local_188 = (REF_NODE)pRVar4->old_n_global;
    local_1ac = ref_cell_ncell(ref_grid->cell[0],pRVar4,(REF_LONG *)local_100);
    if (local_1ac != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x94e,"ref_gather_avm",(ulong)local_1ac);
      goto LAB_0017ad6c;
    }
    local_1ac = ref_cell_ncell(ref_grid->cell[3],pRVar4,(REF_LONG *)local_170);
    if (local_1ac != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x94f,"ref_gather_avm",(ulong)local_1ac);
      goto LAB_0017ad6c;
    }
    local_1ac = ref_cell_ncell(ref_grid->cell[8],pRVar4,(REF_LONG *)local_120);
    if (local_1ac != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x950,"ref_gather_avm",(ulong)local_1ac);
      goto LAB_0017ad6c;
    }
    if (ref_grid->twod == 0) {
      uVar12 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_124,&local_134);
      if (uVar12 != 0) {
        uVar22 = 0x956;
        uVar11 = uVar12;
        goto LAB_0017a11b;
      }
    }
    else {
      uVar12 = ref_cell_id_range(ref_grid->cell[0],ref_mpi,(REF_INT *)&local_124,&local_134);
      if (uVar12 != 0) {
        uVar22 = 0x954;
        uVar11 = uVar12;
LAB_0017a11b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar22,"ref_gather_avm",(ulong)uVar11);
        uVar12 = uVar11;
      }
    }
    local_1ac = uVar11;
    if (uVar12 != 0) goto LAB_0017ad6c;
    if (ref_mpi->id == 0) {
      local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,uVar11);
      iVar10 = local_134 - local_124;
      uStack_74 = 0x4853;
      local_78 = 0x454d5641;
      local_84 = 1;
      local_1ac = 2;
      local_88 = 2;
      local_8c = 1;
      in_stack_fffffffffffffe44 = in_stack_fffffffffffffe44 & 0xffffff;
      local_58 = 0x656e69;
      local_60 = 0x6665722f4153414e;
      local_90 = 2;
      uStack_c4 = 0x656e;
      local_c8 = 0x69666572;
      local_158._0_1_ = 'S';
      local_158._1_1_ = 'k';
      local_158._2_1_ = 'e';
      local_158._3_1_ = 't';
      local_158._4_1_ = 'c';
      local_158._5_1_ = 'h';
      local_158._6_1_ = '2';
      local_158._7_1_ = 'S';
      builtin_strncpy(acStack_150,"olution",8);
      local_40 = 0x63757274736e75;
      uStack_7c = 0x656e;
      local_80 = 0x69666572;
      local_179 = '\0';
      uStack_108 = 0x6e6f697475;
      local_118 = (REF_GLOB *)0x6b53656e69666572;
      uStack_110 = 0x533268637465;
      uStack_10a = 0x6c6f;
      local_48 = 0x3ff0000000000000;
      local_94 = 0;
      local_50 = 0x6d726f66696e75;
      local_1b8 = fopen(filename,"w");
      if (local_1b8 == (FILE *)0x0) {
        bVar32 = false;
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x974,"ref_gather_avm","unable to open file");
      }
      else {
        local_190 = CONCAT44(local_190._4_4_,iVar10);
        sVar14 = fwrite(&local_78,1,6,local_1b8);
        if (sVar14 != 6) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x976,"ref_gather_avm","magic_string",6,sVar14);
          local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
LAB_0017acd5:
          bVar32 = false;
          local_1ac = (uint)local_198;
          goto LAB_0017ad1a;
        }
        sVar14 = fwrite(&local_84,4,1,local_1b8);
        if (sVar14 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x978,"ref_gather_avm","magic_number",1,sVar14);
          local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
          goto LAB_0017acd5;
        }
        sVar14 = fwrite(&local_88,4,1,local_1b8);
        if (sVar14 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x97a,"ref_gather_avm","revision_number",1,sVar14);
          local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
          goto LAB_0017acd5;
        }
        sVar14 = fwrite(&local_8c,4,1,local_1b8);
        if (sVar14 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x97b,"ref_gather_avm","n_meshes",1,sVar14);
          local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
          goto LAB_0017acd5;
        }
        sVar14 = strlen((char *)&local_60);
        in_stack_fffffffffffffe40 = (uint)sVar14;
        sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
        sVar14 = fwrite(&local_60,1,sVar19,local_1b8);
        if (sVar19 != sVar14) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x97f,"ref_gather_avm","contact_info",sVar19,sVar14);
          local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
          goto LAB_0017acd5;
        }
        uVar11 = 0x80 - in_stack_fffffffffffffe40;
        bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
        in_stack_fffffffffffffe40 = uVar11;
        if (bVar32) {
          iVar10 = 0;
          do {
            sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
            if (sVar14 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x982,"ref_gather_avm","nul",1,sVar14);
              local_198 = (REF_GEOM)CONCAT44(local_198._4_4_,1);
              goto LAB_0017acd5;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)in_stack_fffffffffffffe40);
        }
        sVar14 = fwrite(&local_90,4,1,local_1b8);
        local_1ac = (uint)local_198;
        if (sVar14 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x984,"ref_gather_avm","precision",1,sVar14);
          local_1ac = 1;
        }
        bVar32 = false;
        if (sVar14 != 1) goto LAB_0017ad1a;
        local_34 = (ref_grid->twod == 0) + 2;
        sVar14 = fwrite(&local_34,4,1,local_1b8);
        if (sVar14 == 1) {
          sVar14 = strlen((char *)&local_c8);
          in_stack_fffffffffffffe40 = (uint)sVar14;
          sVar14 = fwrite(&stack0xfffffffffffffe40,4,1,local_1b8);
          if (sVar14 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x988,"ref_gather_avm","length",1,sVar14);
            local_1ac = 1;
            goto LAB_0017c5bc;
          }
          sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
          sVar14 = fwrite(&local_c8,1,sVar19,local_1b8);
          if (sVar14 != sVar19) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x98b,"ref_gather_avm","file_description",sVar19,sVar14);
            local_1ac = 1;
            goto LAB_0017c5bc;
          }
          sVar14 = strlen((char *)&local_158);
          in_stack_fffffffffffffe40 = (uint)sVar14;
          sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
          sVar14 = fwrite(&local_158,1,sVar19,local_1b8);
          if (sVar19 != sVar14) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x98e,"ref_gather_avm","mesh_name",sVar19,sVar14);
            local_1ac = 1;
            goto LAB_0017c5bc;
          }
          if ((int)in_stack_fffffffffffffe40 < 0x80) {
            iVar10 = 0;
            in_stack_fffffffffffffe40 = 0x80 - in_stack_fffffffffffffe40;
            do {
              sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
              if (sVar14 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x991,"ref_gather_avm","nul",1,sVar14);
                local_1ac = 1;
                goto LAB_0017c5bc;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)in_stack_fffffffffffffe40);
          }
          sVar14 = strlen((char *)&local_40);
          in_stack_fffffffffffffe40 = (uint)sVar14;
          sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
          sVar14 = fwrite(&local_40,1,sVar19,local_1b8);
          if (sVar19 != sVar14) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x995,"ref_gather_avm","mesh_type",sVar19,sVar14);
            local_1ac = 1;
            goto LAB_0017c5bc;
          }
          if ((int)in_stack_fffffffffffffe40 < 0x80) {
            iVar10 = 0;
            in_stack_fffffffffffffe40 = 0x80 - in_stack_fffffffffffffe40;
            do {
              sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
              if (sVar14 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x998,"ref_gather_avm","nul",1,sVar14);
                local_1ac = 1;
                goto LAB_0017c5bc;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)in_stack_fffffffffffffe40);
          }
          sVar14 = strlen((char *)&local_80);
          in_stack_fffffffffffffe40 = (uint)sVar14;
          sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
          sVar14 = fwrite(&local_80,1,sVar19,local_1b8);
          if (sVar19 != sVar14) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x99d,"ref_gather_avm","mesh_generator",sVar19,sVar14);
            local_1ac = 1;
            goto LAB_0017c5bc;
          }
          uVar11 = 0x80 - in_stack_fffffffffffffe40;
          bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
          in_stack_fffffffffffffe40 = uVar11;
          if (bVar32) {
            iVar10 = 0;
            do {
              sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
              if (sVar14 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9a0,"ref_gather_avm","nul",1,sVar14);
                local_1ac = 1;
                goto LAB_0017c5bc;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)in_stack_fffffffffffffe40);
          }
          if (ref_grid->twod != 0) {
switchD_0017b3a7_caseD_1:
            uStack_144 = 0x4c7a;
            local_148 = 0x55794278;
            goto switchD_0017b3a7_default;
          }
          if (ref_grid->geom->model != (void *)0x0) {
            RVar13 = ref_egads_get_attribute
                               (ref_grid->geom,3,-1,"av:coordinate_system",(char **)local_f8);
            bVar32 = true;
            if (RVar13 == 0) {
              uVar11 = ref_grid_parse_coordinate_system(ref_grid,(char *)local_f8[0]);
              bVar32 = uVar11 == 0;
              if (!bVar32) {
                bVar32 = false;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9ad,"ref_gather_avm",(ulong)uVar11);
                local_1ac = uVar11;
              }
            }
            if (!bVar32) goto LAB_0017c5bc;
          }
          switch(ref_grid->coordinate_system) {
          case REF_GRID_XBYRZU:
            uStack_144 = 0x557a;
            local_148 = 0x52794278;
            break;
          case REF_GRID_XBYUZL:
            goto switchD_0017b3a7_caseD_1;
          case REF_GRID_XFYRZD:
            uStack_144 = 0x447a;
            local_148 = 0x52794678;
            break;
          case REF_GRID_COORDSYS_LAST:
            pcVar29 = "REF_GRID_COORDSYS_LAST";
            uVar22 = 0x9ba;
            goto LAB_0017b8db;
          }
switchD_0017b3a7_default:
          sVar14 = strlen((char *)&local_148);
          in_stack_fffffffffffffe40 = (uint)sVar14;
          sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
          sVar14 = fwrite(&local_148,1,sVar19,local_1b8);
          if (sVar19 == sVar14) {
            uVar11 = 0x80 - in_stack_fffffffffffffe40;
            bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
            in_stack_fffffffffffffe40 = uVar11;
            if (bVar32) {
              iVar10 = 0;
              do {
                sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
                if (sVar14 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x9c3,"ref_gather_avm","nul",1,sVar14);
                  local_1ac = 1;
                  goto LAB_0017c5bc;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)in_stack_fffffffffffffe40);
            }
            sVar14 = fwrite(&local_48,8,1,local_1b8);
            if (sVar14 == 1) {
              if (ref_grid->geom->model != (void *)0x0) {
                RVar13 = ref_egads_get_attribute
                                   (ref_grid->geom,3,-1,"av:mesh_units",(char **)local_f8);
                bVar32 = true;
                if (RVar13 == 0) {
                  uVar11 = ref_grid_parse_unit(ref_grid,(char *)local_f8[0]);
                  bVar32 = uVar11 == 0;
                  if (!bVar32) {
                    bVar32 = false;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x9cd,"ref_gather_avm",(ulong)uVar11);
                    local_1ac = uVar11;
                  }
                }
                if (!bVar32) goto LAB_0017c5bc;
              }
              switch(ref_grid->unit) {
              case REF_GRID_IN:
                local_164 = (uint)local_164._3_1_ << 0x18;
                local_164 = CONCAT22(local_164._2_2_,0x6e69);
                break;
              case REF_GRID_FT:
                local_164 = (uint)local_164._3_1_ << 0x18;
                local_164 = CONCAT22(local_164._2_2_,0x7466);
                break;
              case REF_GRID_M:
                local_164 = CONCAT22(local_164._2_2_,0x6d);
                break;
              case REF_GRID_CM:
                local_164 = (uint)local_164._3_1_ << 0x18;
                local_164 = CONCAT22(local_164._2_2_,0x6d63);
                break;
              case REF_GRID_UNIT_LAST:
                pcVar29 = "REF_GRID_UNIT_LAST";
                uVar22 = 0x9dd;
LAB_0017b8db:
                bVar32 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar22,"ref_gather_avm",pcVar29);
                local_1ac = 1;
                goto LAB_0017ad1a;
              }
              sVar14 = strlen((char *)&local_164);
              in_stack_fffffffffffffe40 = (uint)sVar14;
              sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
              sVar14 = fwrite(&local_164,1,sVar19,local_1b8);
              if (sVar19 == sVar14) {
                uVar11 = 0x80 - in_stack_fffffffffffffe40;
                bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
                in_stack_fffffffffffffe40 = uVar11;
                if (bVar32) {
                  iVar10 = 0;
                  do {
                    sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
                    if (sVar14 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x9e4,"ref_gather_avm","nul",1,sVar14);
                      local_1ac = 1;
                      goto LAB_0017c5bc;
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < (int)in_stack_fffffffffffffe40);
                }
                if ((ref_grid->geom->model != (void *)0x0) &&
                   (RVar13 = ref_egads_get_real_attribute
                                       (ref_grid->geom,3,-1,"av:reference",local_f8,
                                        (REF_INT *)&stack0xfffffffffffffe40),
                   in_stack_fffffffffffffe40 == 7 && RVar13 == 0)) {
                  uVar26 = 0;
                  do {
                    ref_grid->references[uVar26] = local_f8[0][uVar26];
                    uVar26 = uVar26 + 1;
                  } while (in_stack_fffffffffffffe40 != uVar26);
                }
                sVar14 = fwrite(ref_grid->references,8,7,local_1b8);
                if (sVar14 == 7) {
                  sVar14 = strlen(&local_179);
                  in_stack_fffffffffffffe40 = (uint)sVar14;
                  sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
                  sVar14 = fwrite(&local_179,1,sVar19,local_1b8);
                  if (sVar19 == sVar14) {
                    uVar11 = 0x80 - in_stack_fffffffffffffe40;
                    bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
                    in_stack_fffffffffffffe40 = uVar11;
                    if (bVar32) {
                      iVar10 = 0;
                      do {
                        sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x9fa,"ref_gather_avm","nul",1,sVar14);
                          local_1ac = 1;
                          goto LAB_0017c5bc;
                        }
                        iVar10 = iVar10 + 1;
                      } while (iVar10 < (int)in_stack_fffffffffffffe40);
                    }
                    sVar14 = fwrite(&local_94,4,1,local_1b8);
                    if (sVar14 == 1) {
                      sVar14 = strlen((char *)&local_118);
                      in_stack_fffffffffffffe40 = (uint)sVar14;
                      sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
                      sVar14 = fwrite(&local_118,1,sVar19,local_1b8);
                      if (sVar19 == sVar14) {
                        uVar11 = 0x80 - in_stack_fffffffffffffe40;
                        bVar32 = (int)in_stack_fffffffffffffe40 < 0x80;
                        in_stack_fffffffffffffe40 = uVar11;
                        if (bVar32) {
                          iVar10 = 0;
                          do {
                            sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
                            if (sVar14 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0xa03,"ref_gather_avm","nul",1,sVar14);
                              local_1ac = 1;
                              goto LAB_0017c5bc;
                            }
                            iVar10 = iVar10 + 1;
                          } while (iVar10 < (int)in_stack_fffffffffffffe40);
                        }
                        local_19c = (uint)local_188;
                        sVar14 = fwrite(&local_19c,4,1,local_1b8);
                        if (sVar14 == 1) {
                          if (ref_grid->twod == 0) {
                            iVar10 = local_120[0] * 4 + local_170[0];
                          }
                          else {
                            iVar10 = local_170[0] * 3 + local_100[0];
                          }
                          local_19c = iVar10 / 2;
                          sVar14 = fwrite(&local_19c,4,1,local_1b8);
                          if (sVar14 == 1) {
                            puVar20 = local_170;
                            if (ref_grid->twod == 0) {
                              puVar20 = local_120;
                            }
                            local_19c = *puVar20;
                            sVar14 = fwrite(&local_19c,4,1,local_1b8);
                            if (sVar14 == 1) {
                              if (ref_grid->twod == 0) {
                                local_19c = 3;
                                sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                if (sVar14 == 1) {
                                  local_19c = 4;
                                  sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                  if (sVar14 == 1) {
                                    local_19c = 4;
                                    sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                    if (sVar14 != 1) {
                                      uVar22 = 0xa20;
                                      goto LAB_0017bc47;
                                    }
                                    goto LAB_0017bc53;
                                  }
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0xa1e,"ref_gather_avm","max nodes per cell",1,sVar14);
                                  local_1ac = 1;
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0xa1c,"ref_gather_avm","max nodes per face",1,sVar14);
                                  local_1ac = 1;
                                }
                              }
                              else {
                                local_19c = 2;
                                sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                if (sVar14 == 1) {
                                  local_19c = 3;
                                  sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                  if (sVar14 == 1) {
                                    local_19c = 3;
                                    sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                    if (sVar14 != 1) {
                                      uVar22 = 0xa19;
LAB_0017bc47:
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,uVar22,"ref_gather_avm","max faces per cell",1,sVar14)
                                      ;
                                      local_1ac = 1;
                                    }
LAB_0017bc53:
                                    if (sVar14 == 1) {
                                      sVar14 = strlen((char *)&local_50);
                                      in_stack_fffffffffffffe40 = (uint)sVar14;
                                      sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
                                      sVar14 = fwrite(&local_50,1,sVar19,local_1b8);
                                      if (sVar19 == sVar14) {
                                        uVar11 = 0x20 - in_stack_fffffffffffffe40;
                                        bVar32 = (int)in_stack_fffffffffffffe40 < 0x20;
                                        in_stack_fffffffffffffe40 = uVar11;
                                        if (bVar32) {
                                          iVar10 = 0;
                                          do {
                                            sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,local_1b8);
                                            if (sVar14 != 1) {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa28,"ref_gather_avm","nul",1,sVar14);
                                              local_1ac = 1;
                                              goto LAB_0017c5bc;
                                            }
                                            iVar10 = iVar10 + 1;
                                          } while (iVar10 < (int)in_stack_fffffffffffffe40);
                                        }
                                        local_19c = 1;
                                        sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                        if (sVar14 == 1) {
                                          local_19c = 1;
                                          sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                          if (sVar14 == 1) {
                                            local_19c = (int)local_190 + 1;
                                            sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                            if (sVar14 == 1) {
                                              local_19c = 0;
                                              sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                              if (sVar14 == 1) {
                                                puVar20 = local_120;
                                                if (ref_grid->twod != 0) {
                                                  puVar20 = local_170;
                                                }
                                                local_19c = *puVar20;
                                                sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                if (sVar14 == 1) {
                                                  local_19c = 0;
                                                  sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                  if (sVar14 == 1) {
                                                    local_19c = 0;
                                                    sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                    if (sVar14 == 1) {
                                                      puVar20 = local_100;
                                                      if (ref_grid->twod == 0) {
                                                        puVar20 = local_170;
                                                      }
                                                      local_19c = *puVar20;
                                                      sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                      if (sVar14 == 1) {
                                                        sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                        if (sVar14 == 1) {
                                                          local_19c = 0;
                                                          sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                          if (sVar14 == 1) {
                                                            sVar14 = fwrite(&local_19c,4,1,local_1b8
                                                                           );
                                                            if (sVar14 != 1) {
                                                              printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa45,"ref_gather_avm","# quad faces",1,sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  bVar32 = false;
                                                  if (sVar14 == 1) {
                                                    in_stack_fffffffffffffe40 = 5;
                                                    iVar10 = 0;
                                                    do {
                                                      local_19c = 0;
                                                      sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                      if (sVar14 != 1) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa49,"ref_gather_avm","zeros",1,sVar14);
                                                  local_1ac = 1;
                                                  goto LAB_0017c5bc;
                                                  }
                                                  iVar10 = iVar10 + 1;
                                                  } while (iVar10 < (int)in_stack_fffffffffffffe40);
                                                  local_188 = (REF_NODE)(ulong)local_124;
                                                  bVar32 = true;
                                                  if ((int)local_124 <= local_134) {
                                                    do {
                                                      local_198 = ref_grid->geom;
                                                      iVar10 = (ref_grid->twod == 0) + 1;
                                                      RVar13 = ref_egads_get_attribute
                                                                         (local_198,iVar10,
                                                                          (REF_INT)local_188,
                                                                          "av:patch_label",&local_68
                                                                         );
                                                      if (RVar13 != 0) {
                                                        local_68 = "unknown";
                                                      }
                                                      snprintf((char *)local_f8,0x21,"%s-%d",
                                                               local_68,local_188);
                                                      sVar14 = strlen((char *)local_f8);
                                                      in_stack_fffffffffffffe40 = (uint)sVar14;
                                                      sVar19 = (size_t)(int)
                                                  in_stack_fffffffffffffe40;
                                                  sVar14 = fwrite(local_f8,1,sVar19,local_1b8);
                                                  if (sVar19 == sVar14) {
                                                    if ((int)in_stack_fffffffffffffe40 < 0x20) {
                                                      iVar28 = 0;
                                                      in_stack_fffffffffffffe40 =
                                                           0x20 - in_stack_fffffffffffffe40;
                                                      do {
                                                        sVar14 = fwrite(&stack0xfffffffffffffe47,1,1
                                                                        ,local_1b8);
                                                        if (sVar14 != 1) {
                                                          printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa5d,"ref_gather_avm","nul",1,sVar14);
                                                  goto LAB_0017c591;
                                                  }
                                                  iVar28 = iVar28 + 1;
                                                  } while (iVar28 < (int)in_stack_fffffffffffffe40);
                                                  }
                                                  RVar13 = ref_egads_get_attribute
                                                                     (local_198,iVar10,
                                                                      (REF_INT)local_188,
                                                                      "av:patch_type",&local_a0);
                                                  if ((RVar13 != 0) || (local_a0 == (char *)0x0)) {
                                                    local_a0 = "unknown";
                                                  }
                                                  pcVar29 = local_a0;
                                                  sVar14 = strlen(local_a0);
                                                  in_stack_fffffffffffffe40 = (uint)sVar14;
                                                  sVar19 = (size_t)(int)in_stack_fffffffffffffe40;
                                                  sVar14 = fwrite(pcVar29,1,sVar19,local_1b8);
                                                  if (sVar19 != sVar14) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa66,"ref_gather_avm","patch_label",sVar19,
                                                  sVar14);
                                                  goto LAB_0017c591;
                                                  }
                                                  uVar11 = 0x10 - in_stack_fffffffffffffe40;
                                                  bVar32 = (int)in_stack_fffffffffffffe40 < 0x10;
                                                  in_stack_fffffffffffffe40 = uVar11;
                                                  if (bVar32) {
                                                    iVar10 = 0;
                                                    do {
                                                      sVar14 = fwrite(&stack0xfffffffffffffe47,1,1,
                                                                      local_1b8);
                                                      if (sVar14 != 1) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa69,"ref_gather_avm","nul",1,sVar14);
                                                  goto LAB_0017c591;
                                                  }
                                                  iVar10 = iVar10 + 1;
                                                  } while (iVar10 < (int)in_stack_fffffffffffffe40);
                                                  }
                                                  local_19c = -(int)local_188;
                                                  sVar14 = fwrite(&local_19c,4,1,local_1b8);
                                                  bVar32 = sVar14 == 1;
                                                  if (!bVar32) {
                                                    bVar32 = false;
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa6c,"ref_gather_avm","patch ID",1,sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa5a,"ref_gather_avm","patch_label",sVar19,
                                                  sVar14);
LAB_0017c591:
                                                  local_1ac = 1;
                                                  bVar32 = false;
                                                  }
                                                  } while ((bVar32) &&
                                                          (iVar10 = (int)local_188,
                                                          local_188 = (REF_NODE)(ulong)(iVar10 + 1),
                                                          iVar10 < local_134));
                                                  }
                                                  }
                                                  goto LAB_0017ad1a;
                                                  }
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa44,"ref_gather_avm","# boundary quad faces",1,
                                                  sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa42,"ref_gather_avm","# tri faces",1,sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa41,"ref_gather_avm","# boundary tri faces",1,
                                                  sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa3b,"ref_gather_avm","npyr",1,sVar14);
                                                  local_1ac = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa39,"ref_gather_avm","npri",1,sVar14);
                                                  local_1ac = 1;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa37,"ref_gather_avm","ntet",1,sVar14);
                                                  local_1ac = 1;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa31,"ref_gather_avm","nhex",1,sVar14);
                                                local_1ac = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa2f,"ref_gather_avm","# boundary patches",1,
                                                  sVar14);
                                              local_1ac = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xa2d,"ref_gather_avm","cell polynomial order",1,
                                                  sVar14);
                                            local_1ac = 1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                 ,0xa2b,"ref_gather_avm","face polynomial order",1,
                                                 sVar14);
                                          local_1ac = 1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                               ,0xa25,"ref_gather_avm","element_scheme",sVar19,
                                               sVar14);
                                        local_1ac = 1;
                                      }
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                           ,0xa17,"ref_gather_avm","max nodes per cell",1,sVar14);
                                    local_1ac = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0xa15,"ref_gather_avm","max nodes per face",1,sVar14);
                                  local_1ac = 1;
                                }
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0xa12,"ref_gather_avm","ncells",1,sVar14);
                              local_1ac = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0xa0c,"ref_gather_avm","nfaces",1,sVar14);
                            local_1ac = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xa06,"ref_gather_avm","nodes",1,sVar14);
                          local_1ac = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xa00,"ref_gather_avm","mesh_description",sVar19,sVar14);
                        local_1ac = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x9fc,"ref_gather_avm","refined",1,sVar14);
                      local_1ac = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x9f7,"ref_gather_avm","ref_point_desc",sVar19,sVar14);
                    local_1ac = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x9f3,"ref_gather_avm","reference",7,sVar14);
                  local_1ac = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9e1,"ref_gather_avm","mesh_units",sVar19,sVar14);
                local_1ac = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9c5,"ref_gather_avm","model_scale",1,sVar14);
              local_1ac = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x9c0,"ref_gather_avm","coordinate_system",sVar19,sVar14);
            local_1ac = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x986,"ref_gather_avm","dimension",1,sVar14);
          local_1ac = 1;
        }
LAB_0017c5bc:
        bVar32 = false;
      }
LAB_0017ad1a:
      if (!bVar32) goto LAB_0017ad6c;
    }
    else {
      local_1b8 = (FILE *)0x0;
    }
    local_1ac = ref_gather_node(pRVar4,0,0,0,(FILE *)local_1b8);
    if (local_1ac == 0) {
      RVar23 = (REF_INT)local_1b8;
      if (ref_grid->twod == 0) {
        pRVar5 = ref_grid->cell[3];
        if (0 < pRVar5->max) {
          pRVar6 = pRVar5->c2n;
          iVar10 = 0;
          do {
            lVar27 = (long)iVar10 * (long)pRVar5->size_per;
            if (pRVar6[lVar27] != -1) {
              piVar1 = pRVar6 + (long)(int)lVar27 + (long)pRVar5->node_per;
              *piVar1 = -*piVar1;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < pRVar5->max);
        }
        local_1ac = ref_gather_cell(pRVar4,pRVar5,0,1,0,0,0,RVar23,in_stack_fffffffffffffe38,
                                    (FILE *)CONCAT44(in_stack_fffffffffffffe44,
                                                     in_stack_fffffffffffffe40));
        if (local_1ac == 0) {
          if (0 < pRVar5->max) {
            pRVar6 = pRVar5->c2n;
            iVar10 = 0;
            do {
              lVar27 = (long)iVar10 * (long)pRVar5->size_per;
              if (pRVar6[lVar27] != -1) {
                piVar1 = pRVar6 + (long)(int)lVar27 + (long)pRVar5->node_per;
                *piVar1 = -*piVar1;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < pRVar5->max);
          }
          goto LAB_0017af66;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xa9f);
      }
      else {
        pRVar5 = ref_grid->cell[0];
        if (0 < pRVar5->max) {
          pRVar6 = pRVar5->c2n;
          iVar10 = 0;
          do {
            lVar27 = (long)iVar10 * (long)pRVar5->size_per;
            if (pRVar6[lVar27] != -1) {
              piVar1 = pRVar6 + (long)(int)lVar27 + (long)pRVar5->node_per;
              *piVar1 = -*piVar1;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < pRVar5->max);
        }
        local_1ac = ref_gather_cell(pRVar4,pRVar5,0,1,0,0,1,RVar23,in_stack_fffffffffffffe38,
                                    (FILE *)CONCAT44(in_stack_fffffffffffffe44,
                                                     in_stack_fffffffffffffe40));
        if (local_1ac == 0) {
          if (0 < pRVar5->max) {
            pRVar6 = pRVar5->c2n;
            iVar10 = 0;
            do {
              lVar27 = (long)iVar10 * (long)pRVar5->size_per;
              if (pRVar6[lVar27] != -1) {
                piVar1 = pRVar6 + (long)(int)lVar27 + (long)pRVar5->node_per;
                *piVar1 = -*piVar1;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < pRVar5->max);
          }
LAB_0017af66:
          if (ref_grid->twod == 0) {
            local_1ac = ref_gather_cell(pRVar4,ref_grid->cell[8],0,0,0,0,0,RVar23,
                                        in_stack_fffffffffffffe38,
                                        (FILE *)CONCAT44(in_stack_fffffffffffffe44,
                                                         in_stack_fffffffffffffe40));
            if (local_1ac == 0) goto LAB_0017b2c9;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xacc,"ref_gather_avm",(ulong)local_1ac,"nodes");
          }
          else {
            pRVar5 = ref_grid->cell[3];
            if (0 < pRVar5->max) {
              pRVar6 = pRVar5->c2n;
              iVar10 = 0;
              do {
                lVar27 = (long)pRVar5->size_per * (long)iVar10;
                if (pRVar6[lVar27] != -1) {
                  RVar3 = pRVar6[lVar27 + 2];
                  pRVar6[lVar27 + 2] = pRVar6[lVar27 + 1];
                  pRVar6[(long)pRVar5->size_per * (long)iVar10 + 1] = RVar3;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < pRVar5->max);
            }
            local_1ac = ref_gather_cell(pRVar4,pRVar5,0,0,0,0,1,RVar23,in_stack_fffffffffffffe38,
                                        (FILE *)CONCAT44(in_stack_fffffffffffffe44,
                                                         in_stack_fffffffffffffe40));
            if (local_1ac == 0) {
              if (0 < pRVar5->max) {
                pRVar6 = pRVar5->c2n;
                iVar10 = 0;
                do {
                  lVar27 = (long)pRVar5->size_per * (long)iVar10;
                  if (pRVar6[lVar27] != -1) {
                    RVar23 = pRVar6[lVar27 + 2];
                    pRVar6[lVar27 + 2] = pRVar6[lVar27 + 1];
                    pRVar6[(long)pRVar5->size_per * (long)iVar10 + 1] = RVar23;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < pRVar5->max);
              }
LAB_0017b2c9:
              local_1ac = 0;
              if (ref_mpi->id == 0) {
                fclose(local_1b8);
                local_1ac = 0;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xab9,"ref_gather_avm",(ulong)local_1ac,"nodes");
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xa89);
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xa75);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x94b,
           "ref_gather_avm",(ulong)uVar11,"sync");
    local_1ac = uVar11;
  }
LAB_0017ad6c:
  if (local_1ac == 0) {
    return 0;
  }
  pcVar29 = "scalar plt";
  uVar22 = 0xb6e;
LAB_00178972:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar22,
         "ref_gather_by_extension",(ulong)local_1ac,pcVar29);
  return local_1ac;
}

Assistant:

REF_FCN REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 4 && (strcmp(&filename[end_of_string - 4], ".tec") == 0 ||
                            strcmp(&filename[end_of_string - 4], ".dat") == 0 ||
                            strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_tec(ref_grid, filename), "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".avm") == 0)) {
    RSS(ref_gather_avm(ref_grid, filename), "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".plt") == 0)) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 0, NULL, NULL, filename),
        "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        ".lb8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        ".b8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_gather_meshb(ref_grid, filename), "meshb failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "output file name extension unknown", filename);
  return REF_FAILURE;
}